

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexSubImage2DAlignCase::createTexture(TexSubImage2DAlignCase *this)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  int height;
  int iVar5;
  reference pvVar6;
  Vector<float,_4> local_e0;
  Vector<float,_4> local_d0;
  PixelBufferAccess local_c0;
  int local_94;
  int rowPitch;
  Vector<float,_4> local_80;
  PixelBufferAccess local_70;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TexSubImage2DAlignCase *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  iVar5 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (long)(iVar5 * (this->super_Texture2DSpecCase).m_width *
                   (this->super_Texture2DSpecCase).m_height));
  iVar5 = (this->super_Texture2DSpecCase).m_width;
  iVar1 = (this->super_Texture2DSpecCase).m_height;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_70,&(this->super_Texture2DSpecCase).m_texFormat,iVar5,iVar1,1,pvVar6);
  tcu::Vector<float,_4>::Vector(&local_80,0.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff70,1.0);
  tcu::fillWithComponentGradients(&local_70,&local_80,(Vec4 *)&stack0xffffffffffffff70);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  iVar5 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
  iVar1 = (this->super_Texture2DSpecCase).m_width;
  iVar2 = (this->super_Texture2DSpecCase).m_height;
  dVar3 = this->m_format;
  dVar4 = this->m_dataType;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             iVar5,iVar1,iVar2,0,dVar3,dVar4,pvVar6);
  iVar5 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
  local_94 = deAlign32(iVar5 * this->m_subW,this->m_alignment);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (long)(local_94 * this->m_subH));
  iVar2 = local_94;
  iVar5 = this->m_subW;
  iVar1 = this->m_subH;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_c0,&(this->super_Texture2DSpecCase).m_texFormat,iVar5,iVar1,1,iVar2,0,pvVar6);
  tcu::Vector<float,_4>::Vector(&local_d0,1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector(&local_e0,0.0,1.0,0.0,1.0);
  tcu::fillWithGrid(&local_c0,4,&local_d0,&local_e0);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  iVar5 = this->m_subX;
  iVar1 = this->m_subY;
  iVar2 = this->m_subW;
  height = this->m_subH;
  dVar3 = this->m_format;
  dVar4 = this->m_dataType;
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,0);
  sglr::ContextWrapper::glTexSubImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             iVar5,iVar1,iVar2,height,dVar3,dVar4,pvVar6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);

		// Specify base level.
		data.resize(m_texFormat.getPixelSize()*m_width*m_height);
		tcu::fillWithComponentGradients(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, &data[0]), Vec4(0.0f), Vec4(1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, m_format, m_dataType, &data[0]);

		// Re-specify subrectangle.
		int rowPitch = deAlign32(m_texFormat.getPixelSize()*m_subW, m_alignment);
		data.resize(rowPitch*m_subH);
		tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_subW, m_subH, 1, rowPitch, 0, &data[0]), 4, Vec4(1.0f, 0.0f, 0.0f, 1.0f), Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);
		glTexSubImage2D(GL_TEXTURE_2D, 0, m_subX, m_subY, m_subW, m_subH, m_format, m_dataType, &data[0]);
	}